

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::
     applyOperationT<fe::operations::op_premultipliedAlpha,fe::PixelA8,fe::PixelR8G8B8A8>
               (op_premultipliedAlpha *op,PixelA8 *srcPixelFormat,PixelR8G8B8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint8_t *puVar6;
  byte *pbVar7;
  int iVar8;
  uint8_t *puVar9;
  byte *pbVar10;
  uint8_t uVar11;
  
  bVar5 = check(src,dest);
  if ((bVar5) && (iVar2 = (dest->super_fe_image).h, iVar2 != 0)) {
    iVar3 = (dest->super_fe_image).w;
    puVar9 = (dest->super_fe_image).data;
    pbVar10 = (src->super_fe_image).data;
    iVar8 = 0;
    iVar4 = iVar3;
    pbVar7 = pbVar10;
    puVar6 = puVar9;
    do {
      for (; iVar4 != 0; iVar4 = iVar4 + -1) {
        bVar1 = *pbVar10;
        uVar11 = (uint8_t)((ulong)((uint)bVar1 * (uint)bVar1) * 0x1010102 >> 0x20);
        *puVar9 = uVar11;
        puVar9[1] = uVar11;
        puVar9[2] = uVar11;
        puVar9[3] = bVar1;
        puVar9 = puVar9 + (dest->super_fe_image).bytespp;
        pbVar10 = pbVar10 + (src->super_fe_image).bytespp;
      }
      pbVar10 = pbVar7 + (src->super_fe_image).pitch;
      puVar9 = puVar6 + (dest->super_fe_image).pitch;
      iVar8 = iVar8 + 1;
      iVar4 = iVar3;
      pbVar7 = pbVar10;
      puVar6 = puVar9;
    } while (iVar8 != iVar2);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }